

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  GetterXsYs<long_long> *pGVar6;
  TransformerLogLog *pTVar7;
  long lVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<long_long> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [12];
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  int iVar20;
  long lVar21;
  ushort uVar22;
  ImDrawIdx IVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar34;
  float fVar35;
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar47 [16];
  
  pIVar18 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar20 = pGVar6->Count;
  lVar21 = (long)(((pGVar6->Offset + prim + 1) % iVar20 + iVar20) % iVar20) * (long)pGVar6->Stride;
  lVar8 = *(long *)((long)pGVar6->Ys + lVar21);
  dVar13 = log10((double)*(long *)((long)pGVar6->Xs + lVar21) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar18->CurrentPlot;
  dVar1 = pIVar18->LogDenX;
  dVar2 = (pIVar9->XAxis).Range.Min;
  dVar3 = (pIVar9->XAxis).Range.Max;
  dVar14 = log10((double)lVar8 / pIVar9->YAxis[pTVar7->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar20 = pTVar7->YAxis;
  pIVar9 = pIVar18->CurrentPlot;
  pGVar10 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar10->Count;
  auVar39._8_8_ = dVar14;
  auVar39._0_8_ = dVar13;
  dVar13 = pGVar10->YRef;
  auVar15._8_4_ = SUB84(pIVar18->LogDenY[iVar20],0);
  auVar15._0_8_ = dVar1;
  auVar15._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar20] >> 0x20);
  auVar40 = divpd(auVar39,auVar15);
  dVar1 = pIVar9->YAxis[iVar20].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar20].Min;
  fVar29 = (float)(pIVar18->Mx *
                   (((double)(float)auVar40._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  fVar31 = (float)(pIVar18->My[iVar20] *
                   (((double)(float)auVar40._8_8_ * (pIVar9->YAxis[iVar20].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar14 = log10((double)*(long *)((long)pGVar10->Xs +
                                  (long)(((prim + 1 + pGVar10->Offset) % iVar5 + iVar5) % iVar5) *
                                  (long)pGVar10->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar19->CurrentPlot;
  dVar1 = pIVar19->LogDenX;
  dVar2 = (pIVar9->XAxis).Range.Min;
  dVar3 = (pIVar9->XAxis).Range.Max;
  dVar13 = log10(dVar13 / pIVar9->YAxis[pTVar7->YAxis].Range.Min);
  iVar20 = pTVar7->YAxis;
  auVar33._8_8_ = dVar13;
  auVar33._0_8_ = dVar14;
  auVar40._8_4_ = SUB84(pIVar19->LogDenY[iVar20],0);
  auVar40._0_8_ = dVar1;
  auVar40._12_4_ = (int)((ulong)pIVar19->LogDenY[iVar20] >> 0x20);
  auVar40 = divpd(auVar33,auVar40);
  pIVar9 = pIVar19->CurrentPlot;
  dVar1 = pIVar9->YAxis[iVar20].Range.Min;
  IVar4 = pIVar19->PixelRange[iVar20].Min;
  fVar30 = (float)(pIVar19->Mx *
                   (((double)(float)auVar40._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  fVar32 = (float)(pIVar19->My[iVar20] *
                   (((double)(float)auVar40._8_8_ * (pIVar9->YAxis[iVar20].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar16 = (this->P12).x;
  fVar34 = (this->P12).y;
  fVar36 = (this->P11).x;
  fVar37 = (this->P11).y;
  uVar27 = -(uint)(fVar37 < fVar34);
  fVar35 = (float)(~-(uint)(fVar16 <= fVar36) & (uint)fVar16 |
                  (uint)fVar36 & -(uint)(fVar16 <= fVar36));
  fVar38 = (float)(~-(uint)(fVar34 <= fVar37) & (uint)fVar34 |
                  (uint)fVar37 & -(uint)(fVar34 <= fVar37));
  fVar42 = (float)(~-(uint)(fVar36 < fVar16) & (uint)fVar16 |
                  (uint)fVar36 & -(uint)(fVar36 < fVar16));
  fVar51 = (float)(~uVar27 & (uint)fVar34 | (uint)fVar37 & uVar27);
  uVar24 = -(uint)(fVar29 <= fVar35);
  uVar25 = -(uint)(fVar31 <= fVar38);
  uVar26 = -(uint)(fVar42 < fVar29);
  uVar28 = -(uint)(fVar51 < fVar31);
  fVar35 = (float)(~uVar24 & (uint)fVar29 | (uint)fVar35 & uVar24);
  fVar38 = (float)(~uVar25 & (uint)fVar31 | (uint)fVar38 & uVar25);
  fVar42 = (float)(~uVar26 & (uint)fVar29 | (uint)fVar42 & uVar26);
  fVar51 = (float)(~uVar28 & (uint)fVar31 | (uint)fVar51 & uVar28);
  uVar24 = -(uint)(fVar30 <= fVar35);
  uVar25 = -(uint)(fVar32 <= fVar38);
  uVar26 = -(uint)(fVar42 < fVar30);
  uVar28 = -(uint)(fVar51 < fVar32);
  auVar43._0_4_ = (uint)fVar35 & uVar24;
  auVar43._4_4_ = (uint)fVar38 & uVar25;
  auVar43._8_4_ = (uint)fVar42 & uVar26;
  auVar43._12_4_ = (uint)fVar51 & uVar28;
  auVar48._0_4_ = ~uVar24 & (uint)fVar30;
  auVar48._4_4_ = ~uVar25 & (uint)fVar32;
  auVar48._8_4_ = ~uVar26 & (uint)fVar30;
  auVar48._12_4_ = ~uVar28 & (uint)fVar32;
  auVar48 = auVar48 | auVar43;
  fVar35 = (cull_rect->Min).y;
  auVar50._4_4_ = -(uint)(fVar35 < auVar48._4_4_);
  auVar50._0_4_ = -(uint)((cull_rect->Min).x < auVar48._0_4_);
  auVar17._4_8_ = auVar48._8_8_;
  auVar17._0_4_ = -(uint)(auVar48._4_4_ < fVar35);
  auVar49._0_8_ = auVar17._0_8_ << 0x20;
  auVar49._8_4_ = -(uint)(auVar48._8_4_ < (cull_rect->Max).x);
  auVar49._12_4_ = -(uint)(auVar48._12_4_ < (cull_rect->Max).y);
  auVar50._8_8_ = auVar49._8_8_;
  iVar20 = movmskps((int)cull_rect,auVar50);
  if (iVar20 == 0xf) {
    fVar38 = fVar31 * fVar36 - fVar37 * fVar29;
    fVar42 = fVar32 * fVar16 - fVar34 * fVar30;
    fVar35 = fVar34 - fVar32;
    auVar44._4_4_ = fVar35;
    auVar44._0_4_ = fVar35;
    auVar44._8_4_ = fVar35;
    auVar44._12_4_ = fVar35;
    auVar45._4_12_ = auVar44._4_12_;
    auVar45._0_4_ = fVar35 * (fVar36 - fVar29) - (fVar37 - fVar31) * (fVar16 - fVar30);
    auVar41._0_4_ = fVar38 * (fVar16 - fVar30) - fVar42 * (fVar36 - fVar29);
    auVar41._4_4_ = fVar38 * fVar35 - fVar42 * (fVar37 - fVar31);
    auVar41._8_4_ = fVar31 * 0.0 - fVar32 * 0.0;
    auVar41._12_4_ = fVar31 * 0.0 - fVar32 * 0.0;
    auVar47._0_8_ = auVar45._0_8_;
    auVar47._8_4_ = fVar35;
    auVar47._12_4_ = fVar35;
    auVar46._8_8_ = auVar47._8_8_;
    auVar46._4_4_ = auVar45._0_4_;
    auVar46._0_4_ = auVar45._0_4_;
    auVar40 = divps(auVar41,auVar46);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = this->Col;
    pIVar11[1].pos.x = fVar29;
    pIVar11[1].pos.y = fVar31;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = this->Col;
    pIVar11[2].pos = auVar40._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = this->Col;
    pIVar11[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = this->Col;
    IVar4.y = fVar32;
    IVar4.x = fVar30;
    pIVar11[4].pos = IVar4;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar11 + 5;
    uVar24 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar23 = (ImDrawIdx)uVar24;
    *pIVar12 = IVar23;
    uVar22 = (byte)((byte)uVar27 & fVar32 < fVar31 | -(fVar34 < fVar37) & -(fVar31 < fVar32)) & 1;
    pIVar12[1] = IVar23 + uVar22 + 1;
    pIVar12[2] = IVar23 + 3;
    pIVar12[3] = IVar23 + 1;
    pIVar12[4] = (uVar22 ^ 3) + IVar23;
    pIVar12[5] = IVar23 + 4;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar24 + 5;
  }
  (this->P11).x = fVar29;
  (this->P11).y = fVar31;
  (this->P12).x = fVar30;
  (this->P12).y = fVar32;
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }